

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

void __thiscall xe::TestResultParser::updateCurrentItemList(TestResultParser *this)

{
  Item *pIVar1;
  __normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>
  __tmp;
  pointer ppIVar2;
  
  this->m_curItemList = (List *)0x0;
  ppIVar2 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar2 ==
        (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pIVar1 = (Item *)&this->m_result->resultItems;
      goto LAB_00112857;
    }
    pIVar1 = ppIVar2[-1];
    ppIVar2 = ppIVar2 + -1;
    switch(pIVar1->m_type) {
    case TYPE_IMAGESET:
    case TYPE_EGLCONFIGSET:
    case TYPE_SECTION:
      pIVar1 = pIVar1 + 5;
LAB_00112857:
      this->m_curItemList = (List *)pIVar1;
      return;
    case TYPE_SHADERPROGRAM:
      pIVar1 = pIVar1 + 1;
      goto LAB_00112857;
    }
  } while( true );
}

Assistant:

void TestResultParser::updateCurrentItemList (void)
{
	m_curItemList = DE_NULL;

	for (vector<ri::Item*>::reverse_iterator i = m_itemStack.rbegin(); i != m_itemStack.rend(); i++)
	{
		ri::Item*	item	= *i;
		ri::Type	type	= item->getType();

		if (type == ri::TYPE_IMAGESET)
			m_curItemList = &static_cast<ri::ImageSet*>(item)->images;
		else if (type == ri::TYPE_SECTION)
			m_curItemList = &static_cast<ri::Section*>(item)->items;
		else if (type == ri::TYPE_EGLCONFIGSET)
			m_curItemList = &static_cast<ri::EglConfigSet*>(item)->configs;
		else if (type == ri::TYPE_SHADERPROGRAM)
			m_curItemList = &static_cast<ri::ShaderProgram*>(item)->shaders;

		if (m_curItemList)
			break;
	}

	if (!m_curItemList)
		m_curItemList = &m_result->resultItems;
}